

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smf.c
# Opt level: O2

smf_t * smf_new(void)

{
  uint __line;
  int iVar1;
  smf_t *smf;
  GPtrArray *pGVar2;
  int *piVar3;
  char *pcVar4;
  
  smf = (smf_t *)calloc(1,0x50);
  if (smf == (smf_t *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    g_log("libsmf",8,"Cannot allocate smf_t structure: %s",pcVar4);
    return (smf_t *)0x0;
  }
  pGVar2 = (GPtrArray *)g_ptr_array_new();
  smf->tracks_array = pGVar2;
  if (pGVar2 == (GPtrArray *)0x0) {
    pcVar4 = "smf->tracks_array";
    __line = 0x3f;
  }
  else {
    pGVar2 = (GPtrArray *)g_ptr_array_new();
    smf->tempo_array = pGVar2;
    if (pGVar2 == (GPtrArray *)0x0) {
      pcVar4 = "smf->tempo_array";
      __line = 0x42;
    }
    else {
      smf->ppqn = 0x78;
      iVar1 = smf_set_format(smf,0);
      if (iVar1 == 0) {
        smf_init_tempo(smf);
        return smf;
      }
      pcVar4 = "!cantfail";
      __line = 0x48;
    }
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/davidhsilaban[P]munt/mt32emu_smf2wav/libsmf/src/smf.c"
                ,__line,"smf_t *smf_new(void)");
}

Assistant:

smf_t *
smf_new(void)
{
	int cantfail;

	smf_t *smf = malloc(sizeof(smf_t));
	if (smf == NULL) {
		g_critical("Cannot allocate smf_t structure: %s", strerror(errno));
		return (NULL);
	}

	memset(smf, 0, sizeof(smf_t));

	smf->tracks_array = g_ptr_array_new();
	assert(smf->tracks_array);

	smf->tempo_array = g_ptr_array_new();
	assert(smf->tempo_array);

	cantfail = smf_set_ppqn(smf, 120);
	assert(!cantfail);

	cantfail = smf_set_format(smf, 0);
	assert(!cantfail);

	smf_init_tempo(smf);

	return (smf);
}